

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

void __thiscall
tchecker::typed_int_to_clock_assign_statement_t::typed_int_to_clock_assign_statement_t
          (typed_int_to_clock_assign_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::typed_expression_t> *rvalue)

{
  bool bVar1;
  int iVar2;
  expression_type_t eVar3;
  element_type *peVar4;
  invalid_argument *piVar5;
  element_type *this_00;
  shared_ptr<const_tchecker::typed_expression_t> *rvalue_local;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue_local;
  statement_type_t type_local;
  typed_int_to_clock_assign_statement_t *this_local;
  
  statement_t::statement_t((statement_t *)this);
  typed_assign_statement_t::typed_assign_statement_t
            (&this->super_typed_assign_statement_t,&PTR_construction_vtable_56__00348d30,type,lvalue
             ,rvalue);
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t = 0x348c88;
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t = 0x348c88;
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_assign_statement_t = 0x348cf8;
  peVar4 = std::
           __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)lvalue);
  iVar2 = (**(code **)(*(long *)&peVar4->super_typed_expression_t + 0x38))();
  if (iVar2 != 1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"lvalue of size > 1 is not assignable");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar4 = std::
           __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)lvalue);
  eVar3 = typed_expression_t::type(&peVar4->super_typed_expression_t);
  bVar1 = clock_assignable(eVar3);
  if (!bVar1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"lvalue is not an assignable clock");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_00 = std::
            __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)rvalue);
  eVar3 = typed_expression_t::type(this_00);
  bVar1 = integer_valued(eVar3);
  if (!bVar1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"rvalue is not integer valued");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

typed_int_to_clock_assign_statement_t::typed_int_to_clock_assign_statement_t(
    enum tchecker::statement_type_t type, std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & lvalue,
    std::shared_ptr<tchecker::typed_expression_t const> const & rvalue)
    : tchecker::typed_assign_statement_t(type, lvalue, rvalue)
{
  if (lvalue->size() != 1)
    throw std::invalid_argument("lvalue of size > 1 is not assignable");
  if (!tchecker::clock_assignable(lvalue->type()))
    throw std::invalid_argument("lvalue is not an assignable clock");
  if (!tchecker::integer_valued(rvalue->type()))
    throw std::invalid_argument("rvalue is not integer valued");
}